

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_splitBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t blockSize,
                 U32 lastBlock,U32 nbSeq)

{
  undefined8 uVar1;
  long lVar2;
  uint uVar3;
  seqStore_t *seqStore;
  repcodes_t *dRep_00;
  seqStore_t *seqStore_00;
  void *dst_00;
  size_t sVar4;
  void *in_RCX;
  long in_RDI;
  long in_R8;
  undefined4 in_R9D;
  bool bVar5;
  size_t err_code_1;
  size_t srcBytes;
  U32 lastBlockEntireSrc;
  U32 lastPartition;
  size_t cSizeChunk;
  size_t err_code;
  size_t cSizeSingleBlock;
  repcodes_t cRep;
  repcodes_t dRep;
  size_t numSplits;
  seqStore_t *currSeqStore;
  seqStore_t *nextSeqStore;
  U32 *partitions;
  size_t srcBytesTotal;
  size_t i;
  BYTE *op;
  BYTE *ip;
  size_t cSize;
  void *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  U32 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  ZSTD_CCtx *in_stack_ffffffffffffff28;
  size_t local_c8;
  undefined4 local_c0;
  undefined4 local_94;
  undefined4 uVar6;
  undefined4 uVar7;
  ZSTD_CCtx *zc_00;
  void *local_60;
  U32 in_stack_ffffffffffffffc0;
  size_t local_10;
  
  local_10 = 0;
  zc_00 = (ZSTD_CCtx *)0x0;
  seqStore = (seqStore_t *)(in_RDI + 0x1010);
  dRep_00 = (repcodes_t *)(in_RDI + 0xfc0);
  seqStore_00 = (seqStore_t *)(in_RDI + 0xf70);
  dst_00 = (void *)ZSTD_deriveBlockSplits
                             (in_stack_ffffffffffffff28,
                              (U32 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff1c);
  uVar1 = *(undefined8 *)(*(long *)(in_RDI + 0xc68) + 0x15f0);
  local_94 = (undefined4)uVar1;
  uVar6 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar7 = *(undefined4 *)(*(long *)(in_RDI + 0xc68) + 0x15f8);
  memset(dRep_00,0,0x50);
  if (dst_00 == (void *)0x0) {
    local_10 = ZSTD_compressSeqStore_singleBlock
                         (zc_00,seqStore,dRep_00,(repcodes_t *)seqStore_00,(void *)0x0,
                          CONCAT44(uVar7,uVar6),in_RCX,local_10,in_stack_ffffffffffffffc0,(U32)in_R8
                         );
    uVar3 = ERR_isError(local_10);
    if (uVar3 == 0) {
      if (0x20000 < *(ulong *)(in_RDI + 0x2d8)) {
        __assert_fail("zc->blockSize <= ZSTD_BLOCKSIZE_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x60ed,
                      "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
      if (*(long *)(in_RDI + 0x2d8) + 3U < local_10) {
        __assert_fail("cSizeSingleBlock <= zc->blockSize + ZSTD_blockHeaderSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x60ee,
                      "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
    }
  }
  else {
    ZSTD_deriveSeqStoreChunk
              ((seqStore_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (seqStore_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
    for (local_60 = (void *)0x0; local_60 <= dst_00; local_60 = (void *)((long)local_60 + 1)) {
      bVar5 = local_60 == dst_00;
      local_c0 = 0;
      local_c8 = ZSTD_countSeqStoreLiteralsBytes(seqStore_00);
      sVar4 = ZSTD_countSeqStoreMatchBytes(seqStore_00);
      local_c8 = local_c8 + sVar4;
      zc_00 = (ZSTD_CCtx *)((long)&zc_00->stage + local_c8);
      if (bVar5) {
        local_c8 = (in_R8 - (long)zc_00) + local_c8;
        local_c0 = in_R9D;
        in_stack_ffffffffffffff08 = in_RCX;
      }
      else {
        ZSTD_deriveSeqStoreChunk
                  ((seqStore_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (seqStore_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff08 = in_RCX;
      }
      in_stack_ffffffffffffff20 = 1;
      in_stack_ffffffffffffff10 = local_c8;
      in_RCX = in_stack_ffffffffffffff08;
      sVar4 = ZSTD_compressSeqStore_singleBlock
                        (zc_00,seqStore,dRep_00,(repcodes_t *)seqStore_00,dst_00,
                         CONCAT44(uVar7,uVar6),in_stack_ffffffffffffff08,local_10,
                         in_stack_ffffffffffffffc0,(U32)in_R8);
      uVar3 = ERR_isError(sVar4);
      if (uVar3 != 0) {
        return sVar4;
      }
      in_RCX = (void *)(local_c8 + (long)in_RCX);
      local_10 = sVar4 + local_10;
      memcpy(seqStore_00,dRep_00,0x50);
      if (*(long *)(in_RDI + 0x2d8) + 3U < sVar4) {
        __assert_fail("cSizeChunk <= zc->blockSize + ZSTD_blockHeaderSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x6110,
                      "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
      in_stack_ffffffffffffff18 = local_c0;
    }
    lVar2 = *(long *)(in_RDI + 0xc68);
    *(ulong *)(lVar2 + 0x15f0) = CONCAT44(uVar6,local_94);
    *(undefined4 *)(lVar2 + 0x15f8) = uVar7;
  }
  return local_10;
}

Assistant:

static size_t
ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx* zc,
                                    void* dst, size_t dstCapacity,
                              const void* src, size_t blockSize,
                                    U32 lastBlock, U32 nbSeq)
{
    size_t cSize = 0;
    const BYTE* ip = (const BYTE*)src;
    BYTE* op = (BYTE*)dst;
    size_t i = 0;
    size_t srcBytesTotal = 0;
    U32* const partitions = zc->blockSplitCtx.partitions; /* size == ZSTD_MAX_NB_BLOCK_SPLITS */
    seqStore_t* const nextSeqStore = &zc->blockSplitCtx.nextSeqStore;
    seqStore_t* const currSeqStore = &zc->blockSplitCtx.currSeqStore;
    size_t const numSplits = ZSTD_deriveBlockSplits(zc, partitions, nbSeq);

    /* If a block is split and some partitions are emitted as RLE/uncompressed, then repcode history
     * may become invalid. In order to reconcile potentially invalid repcodes, we keep track of two
     * separate repcode histories that simulate repcode history on compression and decompression side,
     * and use the histories to determine whether we must replace a particular repcode with its raw offset.
     *
     * 1) cRep gets updated for each partition, regardless of whether the block was emitted as uncompressed
     *    or RLE. This allows us to retrieve the offset value that an invalid repcode references within
     *    a nocompress/RLE block.
     * 2) dRep gets updated only for compressed partitions, and when a repcode gets replaced, will use
     *    the replacement offset value rather than the original repcode to update the repcode history.
     *    dRep also will be the final repcode history sent to the next block.
     *
     * See ZSTD_seqStore_resolveOffCodes() for more details.
     */
    repcodes_t dRep;
    repcodes_t cRep;
    ZSTD_memcpy(dRep.rep, zc->blockState.prevCBlock->rep, sizeof(repcodes_t));
    ZSTD_memcpy(cRep.rep, zc->blockState.prevCBlock->rep, sizeof(repcodes_t));
    ZSTD_memset(nextSeqStore, 0, sizeof(seqStore_t));

    DEBUGLOG(5, "ZSTD_compressBlock_splitBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)zc->blockState.matchState.window.dictLimit,
                (unsigned)zc->blockState.matchState.nextToUpdate);

    if (numSplits == 0) {
        size_t cSizeSingleBlock =
            ZSTD_compressSeqStore_singleBlock(zc, &zc->seqStore,
                                            &dRep, &cRep,
                                            op, dstCapacity,
                                            ip, blockSize,
                                            lastBlock, 0 /* isPartition */);
        FORWARD_IF_ERROR(cSizeSingleBlock, "Compressing single block from splitBlock_internal() failed!");
        DEBUGLOG(5, "ZSTD_compressBlock_splitBlock_internal: No splits");
        assert(zc->blockSize <= ZSTD_BLOCKSIZE_MAX);
        assert(cSizeSingleBlock <= zc->blockSize + ZSTD_blockHeaderSize);
        return cSizeSingleBlock;
    }

    ZSTD_deriveSeqStoreChunk(currSeqStore, &zc->seqStore, 0, partitions[0]);
    for (i = 0; i <= numSplits; ++i) {
        size_t cSizeChunk;
        U32 const lastPartition = (i == numSplits);
        U32 lastBlockEntireSrc = 0;

        size_t srcBytes = ZSTD_countSeqStoreLiteralsBytes(currSeqStore) + ZSTD_countSeqStoreMatchBytes(currSeqStore);
        srcBytesTotal += srcBytes;
        if (lastPartition) {
            /* This is the final partition, need to account for possible last literals */
            srcBytes += blockSize - srcBytesTotal;
            lastBlockEntireSrc = lastBlock;
        } else {
            ZSTD_deriveSeqStoreChunk(nextSeqStore, &zc->seqStore, partitions[i], partitions[i+1]);
        }

        cSizeChunk = ZSTD_compressSeqStore_singleBlock(zc, currSeqStore,
                                                      &dRep, &cRep,
                                                       op, dstCapacity,
                                                       ip, srcBytes,
                                                       lastBlockEntireSrc, 1 /* isPartition */);
        DEBUGLOG(5, "Estimated size: %zu vs %zu : actual size",
                    ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(currSeqStore, zc), cSizeChunk);
        FORWARD_IF_ERROR(cSizeChunk, "Compressing chunk failed!");

        ip += srcBytes;
        op += cSizeChunk;
        dstCapacity -= cSizeChunk;
        cSize += cSizeChunk;
        *currSeqStore = *nextSeqStore;
        assert(cSizeChunk <= zc->blockSize + ZSTD_blockHeaderSize);
    }
    /* cRep and dRep may have diverged during the compression.
     * If so, we use the dRep repcodes for the next block.
     */
    ZSTD_memcpy(zc->blockState.prevCBlock->rep, dRep.rep, sizeof(repcodes_t));
    return cSize;
}